

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::ModuleDeclarationSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if ((((kind == InterfaceDeclaration) || (kind == ModuleDeclaration)) ||
      (kind == PackageDeclaration)) || (kind == ProgramDeclaration)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ModuleDeclarationSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::InterfaceDeclaration:
        case SyntaxKind::ModuleDeclaration:
        case SyntaxKind::PackageDeclaration:
        case SyntaxKind::ProgramDeclaration:
            return true;
        default:
            return false;
    }
}